

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O3

void __thiscall
OpenCorruptStore_HeaderBadSignature1_Test::~OpenCorruptStore_HeaderBadSignature1_Test
          (OpenCorruptStore_HeaderBadSignature1_Test *this)

{
  (this->super_OpenCorruptStore).super_Test._vptr_Test =
       (_func_int **)&PTR__OpenCorruptStore_0026a490;
  in_memory_store::~in_memory_store(&(this->super_OpenCorruptStore).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F (OpenCorruptStore, HeaderBadSignature1) {
#if PSTORE_SIGNATURE_CHECKS_ENABLED
    // Modify the signature1 field.
    auto * const h = this->get_header ();
    auto & s1 = h->a.signature1;
    s1[0] = !s1[0];
    h->crc = h->get_crc ();
    this->check_database_open (pstore::error_code::header_corrupt);
#endif // PSTORE_SIGNATURE_CHECKS_ENABLED
}